

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

int Bac_BoxAlloc(Bac_Ntk_t *p,Bac_ObjType_t Type,int nIns,int nOuts,int iNtk)

{
  int iVar1;
  int iVar2;
  
  for (; 0 < nIns; nIns = nIns + -1) {
    Bac_ObjAlloc(p,BAC_OBJ_BI,-1);
  }
  iVar1 = Bac_ObjAlloc(p,Type,iNtk);
  iVar2 = 0;
  if (0 < nOuts) {
    iVar2 = nOuts;
  }
  while (iVar2 != 0) {
    Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
    iVar2 = iVar2 + -1;
  }
  return iVar1;
}

Assistant:

static inline int Bac_BoxAlloc( Bac_Ntk_t * p, Bac_ObjType_t Type, int nIns, int nOuts, int iNtk )
{
    int i, iObj;
    for ( i = nIns - 1; i >= 0; i-- )
        Bac_ObjAlloc( p, BAC_OBJ_BI, -1 );
    iObj = Bac_ObjAlloc( p, Type, iNtk );
    for ( i = 0; i < nOuts; i++ )
        Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    return iObj;
}